

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

RenderableTextureT * __thiscall nite::Texture::draw(Texture *this,float x,float y,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  RenderableTextureT *this_00;
  Color *pCVar5;
  long lVar6;
  Vec2 local_48;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  lVar6 = (long)this->objectId;
  if (lVar6 < 0) {
LAB_00199a61:
    this_00 = (RenderableTextureT *)0x0;
  }
  else {
    local_30 = (this->region).w;
    if ((local_30 !=
         (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6].Width) ||
       (NAN(local_30) ||
        NAN((float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6].Width))) {
LAB_0019997e:
      local_2c = (this->region).h;
    }
    else {
      local_2c = (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6].Height;
      fVar1 = (this->region).h;
      if ((fVar1 != local_2c) || (NAN(fVar1) || NAN(local_2c))) goto LAB_0019997e;
      local_30 = (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6].Width;
    }
    local_3c = angle;
    local_38 = y;
    local_34 = x;
    bVar4 = isClippingOut(x,y,local_30,local_2c,0.0,0.0);
    if (bVar4) {
      bVar4 = isItOnBatch();
      if (!bVar4) goto LAB_00199a61;
    }
    this_00 = (RenderableTextureT *)operator_new(0x88);
    RenderableTextureT::RenderableTextureT(this_00);
    (this_00->size).x = local_30;
    (this_00->size).y = local_2c;
    (this_00->super_Renderable).position.x = local_34;
    (this_00->super_Renderable).position.y = local_38;
    this_00->objectId = this->objectId;
    this_00->angle = local_3c;
    this_00->smooth = this->smooth;
    Vec2::Vec2(&local_48,0.0,0.0);
    this_00->origin = local_48;
    (this_00->super_Renderable).function = drawTexture;
    pCVar5 = getColor();
    fVar1 = pCVar5->g;
    fVar2 = pCVar5->b;
    fVar3 = pCVar5->a;
    (this_00->super_Renderable).color.r = pCVar5->r;
    (this_00->super_Renderable).color.g = fVar1;
    (this_00->super_Renderable).color.b = fVar2;
    (this_00->super_Renderable).color.a = fVar3;
    fVar1 = (this->region).y;
    fVar2 = (this->region).w;
    fVar3 = (this->region).h;
    (this_00->region).x = (this->region).x;
    (this_00->region).y = fVar1;
    (this_00->region).w = fVar2;
    (this_00->region).h = fVar3;
    this_00->scale = this->scale;
    addRenderList((Renderable *)this_00);
  }
  return this_00;
}

Assistant:

nite::RenderableTextureT * nite::Texture::draw(float x, float y, float angle){
	if(objectId <= -1) return NULL;
	float rw = textureList[objectId].Width;
	float rh = textureList[objectId].Height;
	if(region.w != textureList[objectId].Width || region.h !=textureList[objectId].Height){
		rw = region.w;
		rh = region.h;
	}
	if(isClippingOut(x, y, rw, rh, 0.0f, 0.0f) && !isItOnBatch()) return NULL;
	nite::RenderableTextureT *obj = new nite::RenderableTextureT();
	obj->size.x			= rw;
	obj->size.y 		= rh;
	obj->position.x 	= x;
	obj->position.y 	= y;
	obj->objectId			= objectId;
	obj->angle 			= angle;
	obj->smooth 		= smooth;
	obj->origin			= nite::Vec2(0, 0);
	obj->function		= &drawTexture;
	obj->color			= nite::getColor();
	obj->region			= region;
	obj->scale			= scale;
	nite::addRenderList((nite::Renderable*)obj);
	return obj;
}